

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::C_UnwrapKey
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hUnwrappingKey,CK_BYTE_PTR pWrappedKey,CK_ULONG ulWrappedKeyLen,
          CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,CK_OBJECT_HANDLE_PTR hKey)

{
  CK_MECHANISM_TYPE CVar1;
  Slot *__s1;
  CK_RV CVar2;
  void *pvVar3;
  _Base_ptr p_Var4;
  char cVar5;
  undefined4 in_EAX;
  int iVar6;
  int iVar7;
  Token *pTVar8;
  SoftHSM *pSVar9;
  CK_STATE CVar10;
  CK_RV CVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar12;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
  *pmVar13;
  Session *pSVar14;
  Token *pTVar15;
  uchar *__s2;
  size_t __n;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long *plVar16;
  OSObject *key;
  OSAttribute *this_00;
  CK_ULONG CVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  Token *local_4b8;
  Session *local_4b0;
  SoftHSM *local_4a8;
  SoftHSM *local_4a0;
  _Base_ptr local_498;
  CK_ULONG local_490;
  CK_OBJECT_CLASS objClass;
  ulong local_480;
  CK_KEY_TYPE keyType;
  ByteString wrapped;
  ByteString keydata;
  ByteString value_1;
  OSAttribute unwrapAttr;
  CK_CERTIFICATE_TYPE dummy;
  CK_ATTRIBUTE secretAttribs [32];
  
  if (this->isInitialised != true) {
    return 400;
  }
  auVar19._0_4_ = -(uint)(pMechanism == (CK_MECHANISM_PTR)0x0);
  auVar19._4_4_ = -(uint)(pWrappedKey == (CK_BYTE_PTR)0x0);
  auVar19._8_4_ = -(uint)(pTemplate == (CK_ATTRIBUTE_PTR)0x0);
  auVar19._12_4_ = -(uint)(hKey == (CK_OBJECT_HANDLE_PTR)0x0);
  iVar6 = movmskps(in_EAX,auVar19);
  if (iVar6 != 0) {
    return 7;
  }
  pSVar9 = (SoftHSM *)this->handleManager;
  local_4a0 = this;
  local_480 = ulWrappedKeyLen;
  local_4b0 = (Session *)HandleManager::getSession((HandleManager *)pSVar9,hSession);
  if (local_4b0 == (Session *)0x0) {
    return 0xb3;
  }
  CVar1 = pMechanism->mechanism;
  if (CVar1 != 1) {
    if (CVar1 == 9) {
      CVar11 = MechParamCheckRSAPKCSOAEP(pSVar9,pMechanism);
      if (CVar11 != 0) {
        return CVar11;
      }
    }
    else {
      if (CVar1 == 0x136) {
        if (pMechanism->pParameter == (void *)0x0) {
          return 7;
        }
        bVar18 = pMechanism->ulParameterLen == 8;
      }
      else if (CVar1 == 0x1085) {
        if (pMechanism->pParameter == (void *)0x0) {
          return 7;
        }
        bVar18 = pMechanism->ulParameterLen == 0x10;
      }
      else {
        if (CVar1 == 0x210a) {
          bVar18 = local_480 < 0x10;
        }
        else {
          if (CVar1 != 0x2109) {
            return 0x70;
          }
          bVar18 = local_480 < 0x18;
        }
        if ((bool)((local_480 & 7) != 0 | bVar18)) {
          return 0x112;
        }
        if (pMechanism->pParameter != (void *)0x0) {
          return 7;
        }
        bVar18 = pMechanism->ulParameterLen == 0;
      }
      if (!bVar18) {
        return 7;
      }
    }
  }
  pTVar8 = Session::getToken(local_4b0);
  if (pTVar8 == (Token *)0x0) {
    return 5;
  }
  pSVar9 = (SoftHSM *)HandleManager::getObject(local_4a0->handleManager,hUnwrappingKey);
  if (pSVar9 == (SoftHSM *)0x0) {
    return 0xf0;
  }
  iVar6 = (*pSVar9->_vptr_SoftHSM[10])(pSVar9);
  pSVar14 = local_4b0;
  if ((char)iVar6 == '\0') {
    return 0xf0;
  }
  local_4b8 = pTVar8;
  iVar6 = (*pSVar9->_vptr_SoftHSM[4])(pSVar9,1,0);
  iVar7 = (*pSVar9->_vptr_SoftHSM[4])(pSVar9,2,1);
  local_4a8 = pSVar9;
  CVar10 = Session::getState(pSVar14);
  CVar11 = haveRead(CVar10,(CK_BBOOL)iVar6,(CK_BBOOL)iVar7);
  pSVar9 = local_4a8;
  if (CVar11 != 0) {
    if (CVar11 != 0x101) {
      return CVar11;
    }
    iVar6 = 0x1b53;
LAB_00141bd1:
    softHSMLog(6,"C_UnwrapKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,iVar6,"User is not authorized");
    return 0x101;
  }
  uVar12 = pMechanism->mechanism;
  if (uVar12 - 0x2109 < 2) {
    iVar6 = (*local_4a8->_vptr_SoftHSM[5])(local_4a8,0,0x80000000);
    if (CONCAT44(extraout_var,iVar6) != 4) {
      return 0xf2;
    }
    uVar12 = pMechanism->mechanism;
    if (uVar12 == 0x2109) {
      iVar6 = (*pSVar9->_vptr_SoftHSM[5])(pSVar9,0x100,0x80000000);
      if (CONCAT44(extraout_var_00,iVar6) != 0x1f) {
        return 0xf2;
      }
      uVar12 = pMechanism->mechanism;
    }
    if (uVar12 == 0x210a) {
      iVar6 = (*pSVar9->_vptr_SoftHSM[5])(pSVar9,0x100,0x80000000);
      if (CONCAT44(extraout_var_01,iVar6) != 0x1f) {
        return 0xf2;
      }
      uVar12 = pMechanism->mechanism;
    }
  }
  if ((uVar12 | 8) == 9) {
    iVar6 = (*pSVar9->_vptr_SoftHSM[5])(pSVar9,0,0x80000000);
    if (CONCAT44(extraout_var_02,iVar6) != 3) {
      return 0xf2;
    }
    uVar12 = pMechanism->mechanism;
  }
  if ((uVar12 | 8) == 9) {
    iVar6 = (*pSVar9->_vptr_SoftHSM[5])(pSVar9,0x100,0x80000000);
    if (CONCAT44(extraout_var_03,iVar6) != 0) {
      return 0xf2;
    }
    uVar12 = pMechanism->mechanism;
  }
  if ((uVar12 == 0x1085) || (uVar12 == 0x1082)) {
    iVar6 = (*pSVar9->_vptr_SoftHSM[5])(pSVar9,0x100,0x80000000);
    if (CONCAT44(extraout_var_04,iVar6) != 0x1f) {
      return 0x115;
    }
    uVar12 = pMechanism->mechanism;
  }
  if (uVar12 == 0x133) {
    iVar6 = (*pSVar9->_vptr_SoftHSM[5])(pSVar9,0x100,0x80000000);
    if (CONCAT44(extraout_var_05,iVar6) != 0x14) {
      return 0x115;
    }
    iVar6 = (*pSVar9->_vptr_SoftHSM[5])(pSVar9,0x100,0x80000000);
    if (CONCAT44(extraout_var_06,iVar6) != 0x15) {
      return 0x115;
    }
  }
  iVar6 = (*pSVar9->_vptr_SoftHSM[4])(pSVar9,0x107,0);
  if ((char)iVar6 == '\0') {
    return 0x68;
  }
  bVar18 = isMechanismPermitted(local_4a0,(OSObject *)pSVar9,pMechanism);
  if (!bVar18) {
    return 0x70;
  }
  isOnToken = '\0';
  isPrivate = '\x01';
  CVar11 = extractObjectInformation
                     (pTemplate,ulCount,&objClass,&keyType,&dummy,&isOnToken,&isPrivate,false);
  if (CVar11 != 0) {
    softHSMLog(3,"C_UnwrapKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x1b7b,"Mandatory attribute not present in template");
    return CVar11;
  }
  if (objClass - 5 < 0xfffffffffffffffe) {
    return 0x13;
  }
  CVar10 = Session::getState(local_4b0);
  CVar11 = haveWrite(CVar10,isOnToken,isPrivate);
  if (CVar11 != 0) {
    if (CVar11 == 0xb5) {
      softHSMLog(6,"C_UnwrapKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x1b8b,"Session is read-only");
      return 0xb5;
    }
    if (CVar11 != 0x101) {
      return CVar11;
    }
    iVar6 = 0x1b89;
    goto LAB_00141bd1;
  }
  memset(secretAttribs,0,0x300);
  secretAttribs[0].pValue = &objClass;
  secretAttribs[0].ulValueLen = 8;
  secretAttribs[1].type = 1;
  secretAttribs[1].pValue = &isOnToken;
  secretAttribs[1].ulValueLen = 1;
  secretAttribs[2].type = 2;
  secretAttribs[2].pValue = &isPrivate;
  secretAttribs[2].ulValueLen = 1;
  secretAttribs[3].type = 0x100;
  secretAttribs[3].pValue = &keyType;
  secretAttribs[3].ulValueLen = 8;
  if (0x1c < ulCount) {
    return 0xd1;
  }
  local_490 = 4;
  while (bVar18 = ulCount != 0, ulCount = ulCount - 1, bVar18) {
    if ((2 < pTemplate->type) && (pTemplate->type != 0x100)) {
      secretAttribs[local_490].ulValueLen = pTemplate->ulValueLen;
      pvVar3 = pTemplate->pValue;
      secretAttribs[local_490].type = pTemplate->type;
      secretAttribs[local_490].pValue = pvVar3;
      local_490 = local_490 + 1;
    }
    pTemplate = pTemplate + 1;
  }
  iVar6 = (*local_4a8->_vptr_SoftHSM[2])(local_4a8,0x40000212);
  if ((char)iVar6 != '\0') {
    (*local_4a8->_vptr_SoftHSM[3])(&unwrapAttr,local_4a8,0x40000212);
    bVar18 = OSAttribute::isAttributeMapAttribute(&unwrapAttr);
    if (bVar18) {
      pmVar13 = OSAttribute::getAttributeMapValue(&unwrapAttr);
      for (local_498 = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)local_498 != &(pmVar13->_M_t)._M_impl.super__Rb_tree_header;
          local_498 = (_Base_ptr)std::_Rb_tree_increment(local_498)) {
        p_Var4 = local_498 + 1;
        local_4b0 = (Session *)secretAttribs;
        pSVar14 = (Session *)0x0;
        CVar17 = local_490;
        while (bVar18 = CVar17 != 0, CVar17 = CVar17 - 1, bVar18) {
          if (*(_func_int ***)(local_498 + 1) == local_4b0->_vptr_Session) {
            if (pSVar14 != (Session *)0x0) goto LAB_0014233f;
            ByteString::ByteString(&wrapped);
            OSAttribute::peekValue((OSAttribute *)&p_Var4->_M_parent,&wrapped);
            pTVar8 = local_4b0->token;
            pTVar15 = (Token *)ByteString::size(&wrapped);
            if (pTVar8 != pTVar15) {
              ByteString::~ByteString(&wrapped);
              goto LAB_0014233f;
            }
            __s1 = local_4b0->slot;
            __s2 = ByteString::const_byte_str(&wrapped);
            __n = ByteString::size(&wrapped);
            iVar6 = bcmp(__s1,__s2,__n);
            ByteString::~ByteString(&wrapped);
            pSVar14 = local_4b0;
            if (iVar6 != 0) goto LAB_0014233f;
          }
          local_4b0 = (Session *)&local_4b0->pApplication;
        }
        if (pSVar14 == (Session *)0x0) {
LAB_0014233f:
          OSAttribute::~OSAttribute(&unwrapAttr);
          return 0xd1;
        }
      }
    }
    OSAttribute::~OSAttribute(&unwrapAttr);
  }
  *hKey = 0;
  ByteString::ByteString(&wrapped,pWrappedKey,local_480);
  ByteString::ByteString(&keydata);
  pSVar9 = local_4a8;
  iVar6 = (*local_4a8->_vptr_SoftHSM[5])(local_4a8,0,0x80000000);
  if (CONCAT44(extraout_var_07,iVar6) == 4) {
    CVar11 = UnwrapKeySym(pSVar9,pMechanism,&wrapped,local_4b8,(OSObject *)local_4a8,&keydata);
  }
  else {
    pSVar9 = local_4a8;
    iVar6 = (*local_4a8->_vptr_SoftHSM[5])(local_4a8,0,0x80000000);
    CVar11 = 0xf2;
    if (CONCAT44(extraout_var_08,iVar6) != 3) goto LAB_0014221f;
    CVar11 = UnwrapKeyAsym(pSVar9,pMechanism,&wrapped,local_4b8,(OSObject *)local_4a8,&keydata);
  }
  if (CVar11 != 0) goto LAB_0014221f;
  CVar11 = CreateObject(local_4a0,hSession,secretAttribs,local_490,hKey,6);
  if (CVar11 == 0) {
    key = (OSObject *)HandleManager::getObject(local_4a0->handleManager,*hKey);
    CVar2 = 6;
    CVar11 = 6;
    if (((key != (OSObject *)0x0) &&
        (iVar6 = (*key->_vptr_OSObject[10])(key), CVar11 = CVar2, (char)iVar6 != '\0')) &&
       (iVar6 = (*key->_vptr_OSObject[0xb])(key), (char)iVar6 != '\0')) {
      OSAttribute::OSAttribute(&unwrapAttr,false);
      iVar6 = (*key->_vptr_OSObject[8])(key,0x163,&unwrapAttr);
      this_00 = &unwrapAttr;
      OSAttribute::~OSAttribute(this_00);
      if ((char)iVar6 == '\0') {
LAB_00142351:
        cVar5 = '\0';
      }
      else {
        OSAttribute::OSAttribute(&unwrapAttr,false);
        iVar6 = (*key->_vptr_OSObject[8])(key,0x165,&unwrapAttr);
        this_00 = &unwrapAttr;
        OSAttribute::~OSAttribute(this_00);
        if ((char)iVar6 == '\0') goto LAB_00142351;
        OSAttribute::OSAttribute(&unwrapAttr,false);
        iVar6 = (*key->_vptr_OSObject[8])(key,0x164,&unwrapAttr);
        cVar5 = (char)iVar6;
        this_00 = &unwrapAttr;
        OSAttribute::~OSAttribute(this_00);
      }
      if (objClass == 4) {
        ByteString::ByteString(&value_1);
        if (isPrivate == '\0') {
          ByteString::operator=(&value_1,&keydata);
        }
        else {
          Token::encrypt(local_4b8,(char *)&keydata,(int)&value_1);
        }
        if (cVar5 != '\0') {
          OSAttribute::OSAttribute(&unwrapAttr,&value_1);
          iVar6 = (*key->_vptr_OSObject[8])(key,0x11,&unwrapAttr);
          OSAttribute::~OSAttribute(&unwrapAttr);
          ByteString::~ByteString(&value_1);
          cVar5 = (char)iVar6;
          goto joined_r0x0014250a;
        }
        ByteString::~ByteString(&value_1);
      }
      else {
        switch(keyType) {
        case 0:
          if (cVar5 != '\0') {
            cVar5 = setRSAPrivateKey((SoftHSM *)this_00,key,&keydata,local_4b8,isPrivate != '\0');
joined_r0x0014250a:
            if (cVar5 != '\0') {
              iVar6 = (*key->_vptr_OSObject[0xc])(key);
              if ((char)iVar6 != '\0') {
                CVar11 = 0;
                goto LAB_0014221f;
              }
              goto LAB_001421cb;
            }
          }
          break;
        case 1:
          if (cVar5 != '\0') {
            cVar5 = setDSAPrivateKey((SoftHSM *)this_00,key,&keydata,local_4b8,isPrivate != '\0');
            goto joined_r0x0014250a;
          }
          break;
        case 2:
          if (cVar5 != '\0') {
            cVar5 = setDHPrivateKey((SoftHSM *)this_00,key,&keydata,local_4b8,isPrivate != '\0');
            goto joined_r0x0014250a;
          }
          break;
        case 3:
          if (cVar5 != '\0') {
            cVar5 = setECPrivateKey((SoftHSM *)this_00,key,&keydata,local_4b8,isPrivate != '\0');
            goto joined_r0x0014250a;
          }
          break;
        default:
          if ((keyType == 0x40) && (cVar5 != '\0')) {
            cVar5 = setEDPrivateKey((SoftHSM *)this_00,key,&keydata,local_4b8,isPrivate != '\0');
            goto joined_r0x0014250a;
          }
        }
      }
      (*key->_vptr_OSObject[0xd])(key);
    }
  }
LAB_001421cb:
  if (*hKey != 0) {
    plVar16 = (long *)HandleManager::getObject(local_4a0->handleManager,*hKey);
    HandleManager::destroyObject(local_4a0->handleManager,*hKey);
    if (plVar16 != (long *)0x0) {
      (**(code **)(*plVar16 + 0x70))(plVar16);
    }
    *hKey = 0;
  }
LAB_0014221f:
  ByteString::~ByteString(&keydata);
  ByteString::~ByteString(&wrapped);
  return CVar11;
}

Assistant:

CK_RV SoftHSM::C_UnwrapKey
(
	CK_SESSION_HANDLE hSession,
	CK_MECHANISM_PTR pMechanism,
	CK_OBJECT_HANDLE hUnwrappingKey,
	CK_BYTE_PTR pWrappedKey,
	CK_ULONG ulWrappedKeyLen,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR hKey
)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pWrappedKey == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pTemplate == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (hKey == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	CK_RV rv;
	// Check the mechanism
	switch(pMechanism->mechanism)
	{
#ifdef HAVE_AES_KEY_WRAP
		case CKM_AES_KEY_WRAP:
			if ((ulWrappedKeyLen < 24) || ((ulWrappedKeyLen % 8) != 0))
				return CKR_WRAPPED_KEY_LEN_RANGE;
			// Does not handle optional init vector
			if (pMechanism->pParameter != NULL_PTR ||
                            pMechanism->ulParameterLen != 0)
				return CKR_ARGUMENTS_BAD;
			break;
#endif
#ifdef HAVE_AES_KEY_WRAP_PAD
		case CKM_AES_KEY_WRAP_PAD:
			if ((ulWrappedKeyLen < 16) || ((ulWrappedKeyLen % 8) != 0))
				return CKR_WRAPPED_KEY_LEN_RANGE;
			// Does not handle optional init vector
			if (pMechanism->pParameter != NULL_PTR ||
                            pMechanism->ulParameterLen != 0)
				return CKR_ARGUMENTS_BAD;
			break;
#endif
		case CKM_RSA_PKCS:
			// Input length checks needs to be done later when unwrapping key is known
			break;
		case CKM_RSA_PKCS_OAEP:
			rv = MechParamCheckRSAPKCSOAEP(pMechanism);
			if (rv != CKR_OK)
				return rv;
			break;

	        case CKM_AES_CBC_PAD:
			// TODO check block length
			if (pMechanism->pParameter == NULL_PTR ||
                            pMechanism->ulParameterLen != 16)
				return CKR_ARGUMENTS_BAD;
			break;

	        case CKM_DES3_CBC_PAD:
			// TODO check block length
			if (pMechanism->pParameter == NULL_PTR ||
                            pMechanism->ulParameterLen != 8)
				return CKR_ARGUMENTS_BAD;
			break;
			
		default:
			return CKR_MECHANISM_INVALID;
	}

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the unwrapping key handle.
	OSObject *unwrapKey = (OSObject *)handleManager->getObject(hUnwrappingKey);
	if (unwrapKey == NULL_PTR || !unwrapKey->isValid()) return CKR_UNWRAPPING_KEY_HANDLE_INVALID;

	CK_BBOOL isUnwrapKeyOnToken = unwrapKey->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isUnwrapKeyPrivate = unwrapKey->getBooleanValue(CKA_PRIVATE, true);

	// Check user credentials
	rv = haveRead(session->getState(), isUnwrapKeyOnToken, isUnwrapKeyPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check unwrapping key class and type
	if ((pMechanism->mechanism == CKM_AES_KEY_WRAP || pMechanism->mechanism == CKM_AES_KEY_WRAP_PAD) && unwrapKey->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) != CKO_SECRET_KEY)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_AES_KEY_WRAP && unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_AES)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_AES_KEY_WRAP_PAD && unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_AES)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if ((pMechanism->mechanism == CKM_RSA_PKCS || pMechanism->mechanism == CKM_RSA_PKCS_OAEP) && unwrapKey->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) != CKO_PRIVATE_KEY)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if ((pMechanism->mechanism == CKM_RSA_PKCS || pMechanism->mechanism == CKM_RSA_PKCS_OAEP) && unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_RSA)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if ((pMechanism->mechanism == CKM_AES_CBC || pMechanism->mechanism == CKM_AES_CBC_PAD) && unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_AES)
		return CKR_WRAPPING_KEY_TYPE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_DES3_CBC && (unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_DES2 ||
		unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_DES3))
		return CKR_WRAPPING_KEY_TYPE_INCONSISTENT;
	
	// Check if the unwrapping key can be used for unwrapping
	if (unwrapKey->getBooleanValue(CKA_UNWRAP, false) == false)
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the unwrap key
	if (!isMechanismPermitted(unwrapKey, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Extract information from the template that is needed to create the object.
	CK_OBJECT_CLASS objClass;
	CK_KEY_TYPE keyType;
	CK_BBOOL isOnToken = CK_FALSE;
	CK_BBOOL isPrivate = CK_TRUE;
	CK_CERTIFICATE_TYPE dummy;
	bool isImplicit = false;
	rv = extractObjectInformation(pTemplate, ulCount, objClass, keyType, dummy, isOnToken, isPrivate, isImplicit);
	if (rv != CKR_OK)
	{
		ERROR_MSG("Mandatory attribute not present in template");
		return rv;
	}

	// Report errors and/or unexpected usage.
	if (objClass != CKO_SECRET_KEY && objClass != CKO_PRIVATE_KEY)
		return CKR_ATTRIBUTE_VALUE_INVALID;
	// Key type will be handled at object creation

	// Check authorization
	rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Build unwrapped key template
	const CK_ULONG maxAttribs = 32;
	CK_ATTRIBUTE secretAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) }
	};
	CK_ULONG secretAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - secretAttribsCount))
		return CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i = 0; i < ulCount; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
				continue;
			default:
				secretAttribs[secretAttribsCount++] = pTemplate[i];
		}
	}

	// Apply the unwrap template
	if (unwrapKey->attributeExists(CKA_UNWRAP_TEMPLATE))
	{
		OSAttribute unwrapAttr = unwrapKey->getAttribute(CKA_UNWRAP_TEMPLATE);

		if (unwrapAttr.isAttributeMapAttribute())
		{
			typedef std::map<CK_ATTRIBUTE_TYPE,OSAttribute> attrmap_type;

			const attrmap_type& map = unwrapAttr.getAttributeMapValue();

			for (attrmap_type::const_iterator it = map.begin(); it != map.end(); ++it)
			{
				CK_ATTRIBUTE* attr = NULL;
				for (CK_ULONG i = 0; i < secretAttribsCount; ++i)
				{
					if (it->first == secretAttribs[i].type)
					{
						if (attr != NULL)
						{
							return CKR_TEMPLATE_INCONSISTENT;
						}
						attr = &secretAttribs[i];
						ByteString value;
						it->second.peekValue(value);
						if (attr->ulValueLen != value.size())
						{
							return CKR_TEMPLATE_INCONSISTENT;
						}
						if (memcmp(attr->pValue, value.const_byte_str(), value.size()) != 0)
						{
							return CKR_TEMPLATE_INCONSISTENT;
						}
					}
				}
				if (attr == NULL)
				{
					return CKR_TEMPLATE_INCONSISTENT;
				}
			}
		}
	}

	*hKey = CK_INVALID_HANDLE;

	// Unwrap the key
	ByteString wrapped(pWrappedKey, ulWrappedKeyLen);
	ByteString keydata;
	if (unwrapKey->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) == CKO_SECRET_KEY)
		rv = UnwrapKeySym(pMechanism, wrapped, token, unwrapKey, keydata);
	else if (unwrapKey->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) == CKO_PRIVATE_KEY)
		rv = UnwrapKeyAsym(pMechanism, wrapped, token, unwrapKey, keydata);
	else
		rv = CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if (rv != CKR_OK)
		return rv;

	// Create the secret object using C_CreateObject
	rv = this->CreateObject(hSession, secretAttribs, secretAttribsCount, hKey, OBJECT_OP_UNWRAP);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*hKey);
		if (osobject == NULL_PTR || !osobject->isValid())
        {
			rv = CKR_FUNCTION_FAILED;
        }
		else if (osobject->startTransaction())
		{
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL, false);

			// Common Secret Key Attributes
			bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE, false);
			bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, false);

			// Secret Attributes
			if (objClass == CKO_SECRET_KEY)
			{
				ByteString value;
				if (isPrivate)
					token->encrypt(keydata, value);
				else
					value = keydata;
				bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			}
			else if (keyType == CKK_RSA)
			{
				bOK = bOK && setRSAPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
			else if (keyType == CKK_DSA)
			{
				bOK = bOK && setDSAPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
			else if (keyType == CKK_DH)
			{
				bOK = bOK && setDHPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
#ifdef WITH_ECC
			else if (keyType == CKK_EC)
			{
				bOK = bOK && setECPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
#endif
#ifdef WITH_EDDSA
			else if (keyType == CKK_EC_EDWARDS)
			{
				bOK = bOK && setEDPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
#endif
#ifdef WITH_GOST
			else if (keyType == CKK_GOSTR3410)
			{
				bOK = bOK && setGOSTPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
#endif
			else
				bOK = false;

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		}
		else
			rv = CKR_FUNCTION_FAILED;
	}

	// Remove secret that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*hKey != CK_INVALID_HANDLE)
		{
			OSObject* obj = (OSObject*)handleManager->getObject(*hKey);
			handleManager->destroyObject(*hKey);
			if (obj) obj->destroyObject();
			*hKey = CK_INVALID_HANDLE;
		}

	}

	return rv;
}